

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_privkey.cpp
# Opt level: O1

void __thiscall
Privkey_FromWif_wif_error_Test::~Privkey_FromWif_wif_error_Test
          (Privkey_FromWif_wif_error_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(Privkey, FromWif_wif_error) {
  try {
    std::string wif = "91xDetrgFxon9rHyPGKg5U5Kjttn6JGiGZc";
    Privkey privkey = Privkey::FromWif(wif, NetType::kTestnet);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "Error WIF to Private key.");
    return;
  }
  ASSERT_TRUE(false);
}